

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall cmNinjaNormalTargetGenerator::WriteLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  cmOutputConverter *this_00;
  cmNinjaDeps *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer *ppbVar3;
  cmGeneratorTarget *pcVar4;
  pointer pcVar5;
  cmOSXBundleGenerator *pcVar6;
  cmLocalNinjaGenerator *pcVar7;
  cmSourceFile *this_01;
  cmMakefile *this_02;
  cmLocalNinjaGenerator *pcVar8;
  size_type sVar9;
  cmCustomCommand *pcVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  ulong uVar11;
  pointer ppcVar12;
  cmNinjaNormalTargetGenerator *this_03;
  bool bVar13;
  bool bVar14;
  TargetType targetType;
  int iVar15;
  TargetType TVar16;
  string *psVar17;
  cmGeneratedFileStream *pcVar18;
  char *pcVar19;
  size_t sVar20;
  ostream *poVar21;
  long *plVar22;
  mapped_type *pmVar23;
  string *psVar24;
  cmGlobalNinjaGenerator *pcVar25;
  cmLinkLineComputer *this_04;
  mapped_type *flags;
  mapped_type *linkFlags;
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar26;
  MapToNinjaPathImpl __unary_op;
  ModuleDefinitionInfo *source;
  size_t sVar27;
  mapped_type_conflict *pmVar28;
  cmGlobalNinjaGenerator *this_05;
  long *plVar29;
  size_type *psVar30;
  size_type sVar31;
  _Alloc_hider _Var32;
  cmOutputConverter *pcVar33;
  cmCustomCommand *cc;
  undefined8 uVar34;
  long lVar35;
  string *obj;
  pointer pbVar36;
  pointer output;
  pointer ppcVar37;
  undefined1 auStack_808 [8];
  cmGeneratorTarget *local_800;
  string objPath;
  bool usedResponseFile;
  string rspfile;
  string obj_list_file;
  string lwyuFlags;
  allocator_type local_761;
  cmNinjaDeps objs;
  string frameworkPath;
  string postBuildCmdLine;
  key_type local_6d8;
  cmNinjaNormalTargetGenerator *local_6b8;
  string linkPath;
  cmNinjaVars vars;
  string cfgName;
  cmNinjaVars symlinkVars;
  string targetOutputReal;
  string targetOutput;
  string createRule;
  cmNinjaDeps symlinks;
  cmNinjaDeps byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  preLinkCmdLines;
  undefined1 local_318 [32];
  cmNinjaDeps outputs;
  string local_2d8;
  cmNinjaDeps emptyDeps;
  string targetOutputImplib;
  cmNinjaDeps explicitDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLineLists [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postBuildCmdLines;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  cmNinjaDeps implicitDeps;
  cmNinjaDeps orderOnlyDeps;
  ostringstream comment;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  undefined4 extraout_var;
  
  pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  psVar17 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cfgName._M_dataplus._M_p = (pointer)&cfgName.field_2;
  pcVar5 = (psVar17->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cfgName,pcVar5,pcVar5 + psVar17->_M_string_length);
  local_800 = pcVar4;
  cmGeneratorTarget::GetFullPath((string *)&symlinkVars,pcVar4,&cfgName,RuntimeBinaryArtifact,false)
  ;
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&targetOutput,&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  cmGeneratorTarget::GetFullPath
            ((string *)&symlinkVars,local_800,&cfgName,RuntimeBinaryArtifact,true);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&targetOutputReal,&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  cmGeneratorTarget::GetFullPath
            ((string *)&symlinkVars,local_800,&cfgName,ImportLibraryArtifact,false);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&targetOutputImplib,&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  bVar13 = cmGeneratorTarget::IsAppBundleOnApple(local_800);
  if (bVar13) {
    cmGeneratorTarget::GetDirectory((string *)&symlinkVars,local_800,&cfgName,RuntimeBinaryArtifact)
    ;
    cmOSXBundleGenerator::CreateAppBundle
              ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator,&(this->TargetNames).Output,
               (string *)&symlinkVars);
    std::__cxx11::string::_M_assign((string *)&targetOutput);
    std::__cxx11::string::append((char *)&targetOutput);
    std::__cxx11::string::_M_append
              ((char *)&targetOutput,(ulong)(this->TargetNames).Output._M_dataplus._M_p);
    cmNinjaTargetGenerator::ConvertToNinjaPath
              ((string *)&comment,&this->super_cmNinjaTargetGenerator,&targetOutput);
    std::__cxx11::string::operator=((string *)&targetOutput,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_198) {
      operator_delete(_comment,local_198[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&targetOutputReal);
    std::__cxx11::string::append((char *)&targetOutputReal);
    std::__cxx11::string::_M_append
              ((char *)&targetOutputReal,(ulong)(this->TargetNames).Real._M_dataplus._M_p);
    cmNinjaTargetGenerator::ConvertToNinjaPath
              ((string *)&comment,&this->super_cmNinjaTargetGenerator,&targetOutputReal);
    std::__cxx11::string::operator=((string *)&targetOutputReal,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_198) {
      operator_delete(_comment,local_198[0]._M_allocated_capacity + 1);
    }
LAB_002c0dc7:
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  else {
    bVar13 = cmGeneratorTarget::IsFrameworkOnApple(local_800);
    if (bVar13) {
      pcVar6 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
      cmGeneratorTarget::GetDirectory
                ((string *)&symlinkVars,local_800,&cfgName,RuntimeBinaryArtifact);
      cmOSXBundleGenerator::CreateFramework
                (pcVar6,&(this->TargetNames).Output,(string *)&symlinkVars);
      goto LAB_002c0dc7;
    }
    bVar13 = cmGeneratorTarget::IsCFBundleOnApple(local_800);
    if (bVar13) {
      pcVar6 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
      cmGeneratorTarget::GetDirectory
                ((string *)&symlinkVars,local_800,&cfgName,RuntimeBinaryArtifact);
      cmOSXBundleGenerator::CreateCFBundle
                (pcVar6,&(this->TargetNames).Output,(string *)&symlinkVars);
      goto LAB_002c0dc7;
    }
  }
  pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar18);
  targetType = cmGeneratorTarget::GetType(local_800);
  pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar18,"# Link build statements for ",0x1c);
  pcVar19 = cmState::GetTargetTypeName(targetType);
  if (pcVar19 == (char *)0x0) {
    std::ios::clear((int)pcVar18 +
                    (int)(pcVar18->super_ofstream).
                         super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3])
    ;
  }
  else {
    sVar20 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar18,pcVar19,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar18," target ",8);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)&symlinkVars,&this->super_cmNinjaTargetGenerator);
  poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pcVar18,(char *)symlinkVars._M_t._M_impl._0_8_,
                       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n\n",2);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,"Link the ",9);
  pcVar19 = GetVisibleTypeName(this);
  if (pcVar19 == (char *)0x0) {
    std::ios::clear((int)(auStack_808 + *(long *)(_comment + -0x18)) + 0x660);
  }
  else {
    sVar20 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,pcVar19,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&comment,targetOutputReal._M_dataplus._M_p,targetOutputReal._M_string_length
            );
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&outputs,&targetOutputReal);
  psVar17 = &this->TargetLinkLanguage;
  iVar15 = std::__cxx11::string::compare((char *)psVar17);
  local_6b8 = this;
  if (iVar15 == 0) {
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"SWIFT_MODULE_NAME","");
    pcVar19 = cmGeneratorTarget::GetProperty(local_800,(string *)&symlinkVars);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if (pcVar19 == (char *)0x0) {
      psVar24 = cmGeneratorTarget::GetName_abi_cxx11_(local_800);
      symlinkVars._M_t._M_impl._0_8_ =
           &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pcVar5 = (psVar24->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&symlinkVars,pcVar5,pcVar5 + psVar24->_M_string_length);
      std::__cxx11::string::append((char *)&symlinkVars);
      paVar1 = &frameworkPath.field_2;
      frameworkPath._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&frameworkPath,"TARGET_SWIFT_DOC","");
      pmVar23 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&frameworkPath);
      std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frameworkPath._M_dataplus._M_p != paVar1) {
        operator_delete(frameworkPath._M_dataplus._M_p,
                        frameworkPath.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
          &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                        (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      psVar24 = cmGeneratorTarget::GetName_abi_cxx11_(local_800);
      symlinkVars._M_t._M_impl._0_8_ =
           &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pcVar5 = (psVar24->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&symlinkVars,pcVar5,pcVar5 + psVar24->_M_string_length);
      std::__cxx11::string::append((char *)&symlinkVars);
      frameworkPath._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&frameworkPath,"TARGET_SWIFT_MODULE","");
      pmVar23 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&frameworkPath);
      std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frameworkPath._M_dataplus._M_p != paVar1) {
        operator_delete(frameworkPath._M_dataplus._M_p,
                        frameworkPath.field_2._M_allocated_capacity + 1);
      }
      uVar34 = symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      _Var32._M_p = (pointer)symlinkVars._M_t._M_impl._0_8_;
      if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
          &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) goto LAB_002c1476;
    }
    else {
      paVar1 = &frameworkPath.field_2;
      frameworkPath._M_dataplus._M_p = (pointer)paVar1;
      sVar20 = strlen(pcVar19);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&frameworkPath,pcVar19,pcVar19 + sVar20);
      plVar22 = (long *)std::__cxx11::string::append((char *)&frameworkPath);
      symlinkVars._M_t._M_impl._0_8_ =
           &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      plVar29 = plVar22 + 2;
      if ((long *)*plVar22 == plVar29) {
        symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar29;
        symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar22[3];
      }
      else {
        symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar29;
        symlinkVars._M_t._M_impl._0_8_ = (long *)*plVar22;
      }
      symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar22[1];
      *plVar22 = (long)plVar29;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      paVar2 = &linkPath.field_2;
      linkPath._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkPath,"TARGET_SWIFT_DOC","");
      pmVar23 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&linkPath);
      std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkPath._M_dataplus._M_p != paVar2) {
        operator_delete(linkPath._M_dataplus._M_p,linkPath.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
          &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                        (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frameworkPath._M_dataplus._M_p != paVar1) {
        operator_delete(frameworkPath._M_dataplus._M_p,
                        frameworkPath.field_2._M_allocated_capacity + 1);
      }
      frameworkPath._M_dataplus._M_p = (pointer)paVar1;
      sVar20 = strlen(pcVar19);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&frameworkPath,pcVar19,pcVar19 + sVar20);
      plVar22 = (long *)std::__cxx11::string::append((char *)&frameworkPath);
      symlinkVars._M_t._M_impl._0_8_ =
           &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      plVar29 = plVar22 + 2;
      if ((long *)*plVar22 == plVar29) {
        symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar29;
        symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar22[3];
      }
      else {
        symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar29;
        symlinkVars._M_t._M_impl._0_8_ = (long *)*plVar22;
      }
      symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar22[1];
      *plVar22 = (long)plVar29;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      linkPath._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkPath,"TARGET_SWIFT_MODULE","");
      pmVar23 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&linkPath);
      std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkPath._M_dataplus._M_p != paVar2) {
        operator_delete(linkPath._M_dataplus._M_p,linkPath.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
          &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                        (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      uVar34 = frameworkPath.field_2._M_allocated_capacity;
      _Var32._M_p = frameworkPath._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frameworkPath._M_dataplus._M_p != paVar1) {
LAB_002c1476:
        operator_delete(_Var32._M_p,(ulong)((long)&((_Base_ptr)uVar34)->_M_color + 1));
      }
    }
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"TARGET_SWIFT_DOC","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&outputs,pmVar23);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"TARGET_SWIFT_MODULE","")
    ;
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&outputs,pmVar23);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
         0xffffffffffffff00);
    objPath.field_2._M_allocated_capacity = 0;
    objPath._M_dataplus._M_p = (pointer)0x0;
    objPath._M_string_length = 0;
    psVar24 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
    cmGeneratorTarget::GetObjectSources
              (local_800,
               (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&objPath,
               psVar24);
    sVar9 = objPath._M_string_length;
    if (objPath._M_dataplus._M_p != (pointer)objPath._M_string_length) {
      paVar1 = &frameworkPath.field_2;
      _Var32 = objPath._M_dataplus;
      do {
        this_01 = *(cmSourceFile **)_Var32._M_p;
        std::__cxx11::string::append((char *)&symlinkVars);
        frameworkPath._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&frameworkPath,"SWIFT_PARTIAL_MODULE","");
        pcVar19 = cmSourceFile::GetProperty(this_01,&frameworkPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)frameworkPath._M_dataplus._M_p != paVar1) {
          operator_delete(frameworkPath._M_dataplus._M_p,
                          frameworkPath.field_2._M_allocated_capacity + 1);
        }
        if (pcVar19 == (char *)0x0) {
          (*(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
            [0xc])(&lwyuFlags,pcVar7,local_800);
          plVar22 = (long *)std::__cxx11::string::append((char *)&lwyuFlags);
          psVar30 = (size_type *)(plVar22 + 2);
          if ((size_type *)*plVar22 == psVar30) {
            createRule.field_2._M_allocated_capacity = *psVar30;
            createRule.field_2._8_8_ = plVar22[3];
            createRule._M_dataplus._M_p = (pointer)&createRule.field_2;
          }
          else {
            createRule.field_2._M_allocated_capacity = *psVar30;
            createRule._M_dataplus._M_p = (pointer)*plVar22;
          }
          createRule._M_string_length = plVar22[1];
          *plVar22 = (long)psVar30;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          psVar24 = cmGeneratorTarget::GetObjectName_abi_cxx11_(local_800,this_01);
          plVar22 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&createRule,(ulong)(psVar24->_M_dataplus)._M_p);
          psVar30 = (size_type *)(plVar22 + 2);
          if ((size_type *)*plVar22 == psVar30) {
            linkPath.field_2._M_allocated_capacity = *psVar30;
            linkPath.field_2._8_8_ = plVar22[3];
            linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
          }
          else {
            linkPath.field_2._M_allocated_capacity = *psVar30;
            linkPath._M_dataplus._M_p = (pointer)*plVar22;
          }
          linkPath._M_string_length = plVar22[1];
          *plVar22 = (long)psVar30;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&linkPath);
          psVar30 = (size_type *)(plVar22 + 2);
          if ((size_type *)*plVar22 == psVar30) {
            frameworkPath.field_2._M_allocated_capacity = *psVar30;
            frameworkPath.field_2._8_8_ = plVar22[3];
            frameworkPath._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            frameworkPath.field_2._M_allocated_capacity = *psVar30;
            frameworkPath._M_dataplus._M_p = (pointer)*plVar22;
          }
          frameworkPath._M_string_length = plVar22[1];
          *plVar22 = (long)psVar30;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)&symlinkVars,(ulong)frameworkPath._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)frameworkPath._M_dataplus._M_p != paVar1) {
            operator_delete(frameworkPath._M_dataplus._M_p,
                            frameworkPath.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
            operator_delete(linkPath._M_dataplus._M_p,linkPath.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)createRule._M_dataplus._M_p != &createRule.field_2) {
            operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
            operator_delete(lwyuFlags._M_dataplus._M_p,
                            CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                                     lwyuFlags.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)&symlinkVars);
        }
        _Var32._M_p = _Var32._M_p + 8;
      } while (_Var32._M_p != (pointer)sVar9);
    }
    frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&frameworkPath,"SWIFT_PARTIAL_MODULES","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&frameworkPath);
    std::__cxx11::string::_M_assign((string *)pmVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
      operator_delete(frameworkPath._M_dataplus._M_p,frameworkPath.field_2._M_allocated_capacity + 1
                     );
    }
    this = local_6b8;
    if (objPath._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(objPath._M_dataplus._M_p,
                      objPath.field_2._M_allocated_capacity - (long)objPath._M_dataplus._M_p);
    }
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  __x = &(this->super_cmNinjaTargetGenerator).Objects;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explicitDeps,__x);
  cmNinjaTargetGenerator::ComputeLinkDeps(&implicitDeps,&this->super_cmNinjaTargetGenerator,psVar17)
  ;
  if ((this->DeviceLinkObject)._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&explicitDeps,&this->DeviceLinkObject);
  }
  this_02 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_allocated_capacity =
       frameworkPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_allocated_capacity =
       linkPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
  psVar24 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,local_800,psVar17,psVar24);
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&symlinkVars,createRule._M_dataplus._M_p,
             createRule._M_dataplus._M_p + createRule._M_string_length);
  std::__cxx11::string::append((char *)&symlinkVars);
  bVar13 = cmMakefile::IsOn(this_02,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  this_00 = &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat((string *)&symlinkVars,this_00,&targetOutputReal,SHELL);
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lwyuFlags,"TARGET_FILE","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  pcVar25 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar8 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar33 = &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar8 == (cmLocalNinjaGenerator *)0x0) {
    pcVar33 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&lwyuFlags,(cmLocalGenerator *)pcVar8);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&symlinkVars,(cmStateSnapshot *)&lwyuFlags);
  iVar15 = (*(pcVar25->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0xe])(pcVar25,pcVar33,&symlinkVars);
  this_04 = (cmLinkLineComputer *)CONCAT44(extraout_var,iVar15);
  cmLinkLineComputer::SetUseWatcomQuote(this_04,bVar13);
  psVar24 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_LIBRARIES","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,(key_type *)&symlinkVars);
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lwyuFlags,"FLAGS","");
  flags = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&vars,&lwyuFlags);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_FLAGS","");
  linkFlags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
  cmLocalGenerator::GetTargetFlags
            ((cmLocalGenerator *)pcVar7,this_04,psVar24,pmVar23,flags,linkFlags,&frameworkPath,
             &linkPath,local_800);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  TVar16 = cmGeneratorTarget::GetType
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  if ((TVar16 == SHARED_LIBRARY) ||
     (TVar16 = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget), TVar16 == MODULE_LIBRARY)) {
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    cmCommonTargetGenerator::AppendOSXVerFlag
              ((cmCommonTargetGenerator *)this,pmVar23,psVar17,"COMPATIBILITY",true);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    cmCommonTargetGenerator::AppendOSXVerFlag
              ((cmCommonTargetGenerator *)this,pmVar23,psVar17,"CURRENT",false);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"JOB_POOL_LINK","");
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars,local_800,&vars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_FLAGS","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,(key_type *)&symlinkVars);
  cmCommonTargetGenerator::AddModuleDefinitionFlag((cmCommonTargetGenerator *)this,this_04,pmVar23);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lwyuFlags,"LINK_FLAGS","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  cmGlobalNinjaGenerator::EncodeLiteral((string *)&symlinkVars,pmVar23);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_FLAGS","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  cmCommonTargetGenerator::GetManifests_abi_cxx11_
            ((string *)&symlinkVars,(cmCommonTargetGenerator *)this);
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lwyuFlags,"MANIFESTS","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&symlinkVars,
                 &frameworkPath,&linkPath);
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lwyuFlags,"LINK_PATH","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  lwyuFlags._M_string_length = 0;
  lwyuFlags.field_2._M_local_buf[0] = '\0';
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_WHAT_YOU_USE","");
  bVar13 = cmGeneratorTarget::GetPropertyAsBool(local_800,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if (bVar13) {
    std::__cxx11::string::_M_replace
              ((ulong)&lwyuFlags,0,(char *)lwyuFlags._M_string_length,0x4f1c34);
  }
  if (targetType == EXECUTABLE) {
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar5 = (pmVar23->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&symlinkVars,pcVar5,pcVar5 + pmVar23->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
    }
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)pcVar7,(string *)&symlinkVars,local_800,psVar17,&cfgName);
    std::__cxx11::string::_M_append((char *)&symlinkVars,(ulong)lwyuFlags._M_dataplus._M_p);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar23);
  }
  else {
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"ARCH_FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar5 = (pmVar23->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&symlinkVars,pcVar5,pcVar5 + pmVar23->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
    }
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)pcVar7,(string *)&symlinkVars,local_800,psVar17,&cfgName);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"ARCH_FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
    }
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    *(undefined1 *)symlinkVars._M_t._M_impl._0_8_ = 0;
    std::__cxx11::string::_M_append((char *)&symlinkVars,(ulong)lwyuFlags._M_dataplus._M_p);
    cmLocalGenerator::AddLanguageFlagsForLinking
              ((cmLocalGenerator *)pcVar7,(string *)&symlinkVars,local_800,psVar17,&cfgName);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LANGUAGE_COMPILE_FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar23);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  bVar13 = cmGeneratorTarget::HasSOName
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget,&cfgName);
  if (bVar13) {
    __s = cmMakefile::GetSONameFlag(this_02,psVar17);
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"SONAME_FLAG","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    pcVar19 = (char *)pmVar23->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar23,0,pcVar19,(ulong)__s);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"SONAME","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::__cxx11::string::_M_assign((string *)pmVar23);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if (targetType == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)&symlinkVars,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 &cfgName);
      if (symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
        cmOutputConverter::ConvertToOutputFormat(&objPath,this_00,(string *)&symlinkVars,SHELL);
        postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&postBuildCmdLine,"INSTALLNAME_DIR","");
        pmVar23 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&vars,&postBuildCmdLine);
        std::__cxx11::string::operator=((string *)pmVar23,(string *)&objPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
          operator_delete(postBuildCmdLine._M_dataplus._M_p,
                          CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                                   postBuildCmdLine.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
      }
      if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
          &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                        (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
    }
  }
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->TargetNames).ImportLibrary._M_string_length != 0) {
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&symlinkVars,this_00,&targetOutputImplib,SHELL);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"TARGET_IMPLIB","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
    }
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars);
    bVar13 = cmGeneratorTarget::HasImportLibrary(local_800,&cfgName);
    if (bVar13) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&byproducts,&targetOutputImplib);
    }
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  bVar13 = cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
                     (&this->super_cmNinjaTargetGenerator,&vars);
  if (!bVar13) {
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
         0xffffffffffffff00);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    objPath._M_string_length = 0;
    objPath.field_2._M_allocated_capacity =
         objPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
    postBuildCmdLine._M_string_length = 0;
    postBuildCmdLine.field_2._M_local_buf[0] = '\0';
    pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    paVar1 = &rspfile.field_2;
    rspfile._M_dataplus._M_p = (pointer)paVar1;
    postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"");
    cmGeneratorTarget::GetFullNameComponents
              (pcVar4,(string *)&symlinkVars,&objPath,&postBuildCmdLine,&rspfile,
               RuntimeBinaryArtifact);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar1) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    rspfile._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,".dbg","");
    paVar2 = &obj_list_file.field_2;
    obj_list_file._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&obj_list_file,"CMAKE_DEBUG_SYMBOL_SUFFIX","");
    pcVar19 = cmMakefile::GetDefinition(this_02,&obj_list_file);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_list_file._M_dataplus._M_p != paVar2) {
      operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1
                     );
    }
    if (pcVar19 != (char *)0x0) {
      obj_list_file._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&obj_list_file,"CMAKE_DEBUG_SYMBOL_SUFFIX","");
      pcVar19 = cmMakefile::GetDefinition(this_02,&obj_list_file);
      strlen(pcVar19);
      std::__cxx11::string::_M_replace
                ((ulong)&rspfile,0,(char *)rspfile._M_string_length,(ulong)pcVar19);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_list_file._M_dataplus._M_p != paVar2) {
        operator_delete(obj_list_file._M_dataplus._M_p,
                        obj_list_file.field_2._M_allocated_capacity + 1);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objs,
                   &objPath,&postBuildCmdLine);
    plVar22 = (long *)std::__cxx11::string::_M_append((char *)&objs,(ulong)rspfile._M_dataplus._M_p)
    ;
    psVar30 = (size_type *)(plVar22 + 2);
    if ((size_type *)*plVar22 == psVar30) {
      obj_list_file.field_2._M_allocated_capacity = *psVar30;
      obj_list_file.field_2._8_8_ = plVar22[3];
      obj_list_file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      obj_list_file.field_2._M_allocated_capacity = *psVar30;
      obj_list_file._M_dataplus._M_p = (pointer)*plVar22;
    }
    obj_list_file._M_string_length = plVar22[1];
    *plVar22 = (long)psVar30;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"TARGET_PDB","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&local_6d8);
    std::__cxx11::string::operator=((string *)pmVar23,(string *)&obj_list_file);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
      operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_list_file._M_dataplus._M_p != paVar2) {
      operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1
                     );
    }
    if (objs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&objs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(objs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((objs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar1) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    this = local_6b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
    }
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  pcVar8 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&postBuildCmdLine,&this->super_cmNinjaTargetGenerator,&objPath);
  cmOutputConverter::ConvertToOutputFormat
            ((string *)&symlinkVars,
             &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &postBuildCmdLine,SHELL);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"OBJECT_DIR","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  pcVar25 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  if (pcVar25->UsingGCCOnWindows == true) {
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_LIBRARIES","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    sVar9 = pmVar23->_M_string_length;
    if (sVar9 != 0) {
      pcVar5 = (pmVar23->_M_dataplus)._M_p;
      sVar31 = 0;
      do {
        if (pcVar5[sVar31] == '\\') {
          pcVar5[sVar31] = '/';
        }
        sVar31 = sVar31 + 1;
      } while (sVar9 != sVar31);
    }
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_PATH","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    sVar9 = pmVar23->_M_string_length;
    if (sVar9 != 0) {
      pcVar5 = (pmVar23->_M_dataplus)._M_p;
      sVar31 = 0;
      do {
        if (pcVar5[sVar31] == '\\') {
          pcVar5[sVar31] = '/';
        }
        sVar31 = sVar31 + 1;
      } while (sVar9 != sVar31);
    }
  }
  pcVar4 = local_800;
  cmdLists[0] = cmGeneratorTarget::GetPreBuildCommands(local_800);
  cmdLists[1] = cmGeneratorTarget::GetPreLinkCommands(pcVar4);
  cmdLists[2] = cmGeneratorTarget::GetPostBuildCommands(pcVar4);
  lVar35 = 0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLineLists[0] = &preLinkCmdLines;
  cmdLineLists[1] = &preLinkCmdLines;
  cmdLineLists[2] = &postBuildCmdLines;
  do {
    pcVar10 = (cmdLists[lVar35]->
              super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (cc = (cmdLists[lVar35]->
              super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
              super__Vector_impl_data._M_start; cc != pcVar10; cc = cc + 1) {
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,cfgName._M_dataplus._M_p,
                 cfgName._M_dataplus._M_p + cfgName._M_string_length);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&symlinkVars,cc,&local_2d8,
                 (cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      cmLocalNinjaGenerator::AppendCustomCommandLines
                (pcVar7,(cmCustomCommandGenerator *)&symlinkVars,cmdLineLists[lVar35]);
      pvVar26 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)&symlinkVars);
      __first._M_current =
           (pvVar26->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (pvVar26->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      __unary_op.GG =
           cmNinjaTargetGenerator::GetGlobalGenerator(&local_6b8->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (__first,__last,&byproducts,__unary_op);
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&symlinkVars);
      this = local_6b8;
    }
    lVar35 = lVar35 + 1;
  } while (lVar35 != 3);
  psVar24 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  source = cmGeneratorTarget::GetModuleDefinitionInfo(local_800,psVar24);
  if ((source != (ModuleDefinitionInfo *)0x0) && (source->DefFileGenerated == true)) {
    pcVar8 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar24 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (&postBuildCmdLine,
               &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar24,SHELL);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&rspfile,postBuildCmdLine._M_dataplus._M_p,
               postBuildCmdLine._M_dataplus._M_p + postBuildCmdLine._M_string_length);
    std::__cxx11::string::append((char *)&rspfile);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&symlinkVars,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).super_cmLocalGenerator.super_cmOutputConverter,&source->DefFile,SHELL);
    std::__cxx11::string::_M_append((char *)&rspfile,symlinkVars._M_t._M_impl._0_8_);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    std::__cxx11::string::append((char *)&rspfile);
    obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
    pcVar5 = (source->DefFile)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&obj_list_file,pcVar5,pcVar5 + (source->DefFile)._M_string_length);
    std::__cxx11::string::append((char *)&obj_list_file);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&symlinkVars,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).super_cmLocalGenerator.super_cmOutputConverter,&obj_list_file,SHELL);
    std::__cxx11::string::_M_append((char *)&rspfile,symlinkVars._M_t._M_impl._0_8_);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&preLinkCmdLines
               ,&rspfile);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&symlinkVars,&obj_list_file,false,None);
    if (source->WindowsExportAllSymbols == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&objs,__x);
      for (pbVar36 = objs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar36 !=
          objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar36 = pbVar36 + 1) {
        uVar11 = pbVar36->_M_string_length;
        if (3 < uVar11) {
          pcVar19 = (pbVar36->_M_dataplus)._M_p;
          iVar15 = strcmp(pcVar19 + (uVar11 - 4),".obj");
          if (iVar15 == 0) {
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&symlinkVars,pcVar19,uVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&objs);
      this = local_6b8;
    }
    ppcVar37 = (source->Sources).
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppcVar12 = (source->Sources).
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar37 != ppcVar12) {
      do {
        psVar24 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar37);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&symlinkVars,(psVar24->_M_dataplus)._M_p,
                             psVar24->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
        ppcVar37 = ppcVar37 + 1;
      } while (ppcVar37 != ppcVar12);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&symlinkVars);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
      operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
  }
  if (preLinkCmdLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      preLinkCmdLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar24 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar7);
    cmOutputConverter::ConvertToOutputFormat((string *)&symlinkVars,this_00,psVar24,SHELL);
    std::operator+(&postBuildCmdLine,"cd ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&symlinkVars
                  );
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&preLinkCmdLines
               ,&postBuildCmdLine);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&postBuildCmdLine,"pre-link","");
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)&symlinkVars,pcVar7,&preLinkCmdLines,&postBuildCmdLine,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"PRE_LINK","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"post-build","");
  cmLocalNinjaGenerator::BuildCommandLine
            (&postBuildCmdLine,pcVar7,&postBuildCmdLines,(string *)&symlinkVars,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((targetOutput._M_string_length == targetOutputReal._M_string_length) &&
      ((targetOutput._M_string_length == 0 ||
       (iVar15 = bcmp(targetOutput._M_dataplus._M_p,targetOutputReal._M_dataplus._M_p,
                      targetOutput._M_string_length), iVar15 == 0)))) ||
     (bVar13 = cmGeneratorTarget::IsFrameworkOnApple(local_800), bVar13)) {
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"POST_BUILD","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    bVar13 = false;
  }
  else {
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"POST_BUILD","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"POST_BUILD","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&symlinkVars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    bVar13 = true;
  }
  pcVar25 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  iVar15 = std::__cxx11::string::compare((char *)psVar17);
  if ((iVar15 != 0) && (iVar15 = std::__cxx11::string::compare((char *)psVar17), iVar15 != 0)) {
    bVar14 = cmNinjaTargetGenerator::ForceResponseFile(&this->super_cmNinjaTargetGenerator);
    iVar15 = -1;
    if (bVar14) goto LAB_002c35a5;
  }
  sVar27 = cmSystemTools::CalculateCommandLineLengthLimit();
  LanguageLinkerRule_abi_cxx11_(&rspfile,this);
  pmVar28 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](&pcVar25->RuleCmdLength,&rspfile);
  iVar15 = (int)sVar27 - *pmVar28;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
LAB_002c35a5:
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"CMakeFiles/","");
  psVar17 = cmGeneratorTarget::GetName_abi_cxx11_(local_800);
  plVar22 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_6d8,(ulong)(psVar17->_M_dataplus)._M_p);
  ppbVar3 = &objs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar36 = (pointer)(plVar22 + 2);
  if ((pointer)*plVar22 == pbVar36) {
    objs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar36->_M_dataplus)._M_p;
    objs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar3;
  }
  else {
    objs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar36->_M_dataplus)._M_p;
    objs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar22;
  }
  objs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar22[1];
  *plVar22 = (long)pbVar36;
  plVar22[1] = 0;
  *(undefined1 *)(plVar22 + 2) = 0;
  plVar22 = (long *)std::__cxx11::string::append((char *)&objs);
  psVar30 = (size_type *)(plVar22 + 2);
  if ((size_type *)*plVar22 == psVar30) {
    obj_list_file.field_2._M_allocated_capacity = *psVar30;
    obj_list_file.field_2._8_8_ = plVar22[3];
    obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
  }
  else {
    obj_list_file.field_2._M_allocated_capacity = *psVar30;
    obj_list_file._M_dataplus._M_p = (pointer)*plVar22;
  }
  obj_list_file._M_string_length = plVar22[1];
  *plVar22 = (long)psVar30;
  plVar22[1] = 0;
  *(undefined1 *)(plVar22 + 2) = 0;
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&rspfile,&this->super_cmNinjaTargetGenerator,&obj_list_file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
    operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1);
  }
  if (objs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar3) {
    operator_delete(objs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((objs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &orderOnlyDeps,DependOnTargetArtifact);
  pcVar19 = "";
  if (byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar19 = "1";
  }
  obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&obj_list_file,"RESTAT","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&obj_list_file);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar23,0,(char *)pmVar23->_M_string_length,(ulong)pcVar19);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
    operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1);
  }
  pbVar36 = byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    output = byproducts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_05 = cmNinjaTargetGenerator::GetGlobalGenerator(&local_6b8->super_cmNinjaTargetGenerator)
      ;
      cmGlobalNinjaGenerator::SeenCustomCommandOutput(this_05,output);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&outputs,output);
      output = output + 1;
    } while (output != pbVar36);
  }
  this_03 = local_6b8;
  usedResponseFile = false;
  pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&local_6b8->super_cmNinjaTargetGenerator);
  std::__cxx11::stringbuf::str();
  LanguageLinkerRule_abi_cxx11_((string *)&objs,this_03);
  local_6d8._M_dataplus._M_p = (pointer)0x0;
  local_6d8._M_string_length = 0;
  local_6d8.field_2._M_allocated_capacity = 0;
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar25,(ostream *)pcVar18,&obj_list_file,(string *)&objs,&outputs,
             (cmNinjaDeps *)&local_6d8,&explicitDeps,&implicitDeps,&orderOnlyDeps,&vars,&rspfile,
             iVar15,&usedResponseFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_6d8);
  if (objs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&objs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(objs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((objs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
    operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1);
  }
  WriteLinkRule(this_03,usedResponseFile);
  if (bVar13) {
    if (targetType == EXECUTABLE) {
      pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&this_03->super_cmNinjaTargetGenerator);
      std::operator+(&obj_list_file,"Create executable symlink ",&targetOutput);
      ppbVar3 = &objs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      objs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&objs,"CMAKE_SYMLINK_EXECUTABLE","")
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_318,1,&targetOutput,(allocator_type *)&local_1f8);
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_358,1,&targetOutputReal,&local_761);
      local_6d8._M_string_length = 0;
      local_6d8.field_2._M_allocated_capacity =
           local_6d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar25,(ostream *)pcVar18,&obj_list_file,(string *)&objs,(cmNinjaDeps *)local_318,
                 &symlinks,&local_358,&emptyDeps,&emptyDeps,&symlinkVars,&local_6d8,0,(bool *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_358);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&symlinks);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_318);
      if (objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar3) {
        operator_delete(objs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((objs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
        operator_delete(obj_list_file._M_dataplus._M_p,
                        obj_list_file.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmNinjaTargetGenerator::GetTargetFilePath
                ((string *)&objs,&this_03->super_cmNinjaTargetGenerator,
                 &(this_03->TargetNames).SharedObject);
      ppbVar3 = &objs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&obj_list_file,&this_03->super_cmNinjaTargetGenerator,(string *)&objs);
      if (objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar3) {
        operator_delete(objs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((objs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      sVar9 = obj_list_file._M_string_length;
      if (((targetOutputReal._M_string_length == obj_list_file._M_string_length) &&
          ((targetOutputReal._M_string_length == 0 ||
           (iVar15 = bcmp(targetOutputReal._M_dataplus._M_p,obj_list_file._M_dataplus._M_p,
                          targetOutputReal._M_string_length), iVar15 == 0)))) ||
         ((targetOutput._M_string_length == sVar9 &&
          ((sVar9 == 0 ||
           (iVar15 = bcmp(targetOutput._M_dataplus._M_p,obj_list_file._M_dataplus._M_p,sVar9),
           iVar15 == 0)))))) {
        objs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objs,"SONAME","");
        pmVar23 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&symlinkVars,(key_type *)&objs);
        std::__cxx11::string::_M_assign((string *)pmVar23);
        if (objs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar3) {
          operator_delete(objs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((objs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
      }
      else {
        objs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objs,"SONAME","");
        pmVar23 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&symlinkVars,(key_type *)&objs);
        pmVar23->_M_string_length = 0;
        *(pmVar23->_M_dataplus)._M_p = '\0';
        if (objs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar3) {
          operator_delete(objs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((objs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&symlinks,&obj_list_file);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&symlinks,&targetOutput);
      pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&this_03->super_cmNinjaTargetGenerator);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objs,
                     "Create library symlink ",&targetOutput);
      local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8,"CMAKE_SYMLINK_LIBRARY","");
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1f8,1,&targetOutputReal,&local_761);
      local_318._8_8_ = (pointer)0x0;
      local_318[0x10] = '\0';
      local_318._0_8_ = (pointer)(local_318 + 0x10);
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar25,(ostream *)pcVar18,(string *)&objs,&local_6d8,&symlinks,&local_358,
                 &local_1f8,&emptyDeps,&emptyDeps,&symlinkVars,(string *)local_318,0,(bool *)0x0);
      if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,CONCAT71(local_318._17_7_,local_318[0x10]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
      }
      if (objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar3) {
        operator_delete(objs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((objs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
        operator_delete(obj_list_file._M_dataplus._M_p,
                        obj_list_file.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&symlinks);
    }
  }
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar25,&(this_03->TargetNames).Output,local_800);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            (&obj_list_file,&this_03->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar25,&obj_list_file,local_800);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
    operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&orderOnlyDeps);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&symlinkVars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&postBuildCmdLines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&preLinkCmdLines);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  (*this_04->_vptr_cmLinkLineComputer[1])();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)createRule._M_dataplus._M_p != &createRule.field_2) {
    operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
    operator_delete(linkPath._M_dataplus._M_p,linkPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,frameworkPath.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  std::ios_base::~ios_base(local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&emptyDeps);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputImplib._M_dataplus._M_p != &targetOutputImplib.field_2) {
    operator_delete(targetOutputImplib._M_dataplus._M_p,
                    targetOutputImplib.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputReal._M_dataplus._M_p != &targetOutputReal.field_2) {
    operator_delete(targetOutputReal._M_dataplus._M_p,
                    targetOutputReal.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutput._M_dataplus._M_p != &targetOutput.field_2) {
    operator_delete(targetOutput._M_dataplus._M_p,targetOutput.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cfgName._M_dataplus._M_p != &cfgName.field_2) {
    operator_delete(cfgName._M_dataplus._M_p,cfgName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkStatement()
{
  cmGeneratorTarget& gt = *this->GetGeneratorTarget();
  const std::string cfgName = this->GetConfigName();
  std::string targetOutput = ConvertToNinjaPath(gt.GetFullPath(cfgName));
  std::string targetOutputReal = ConvertToNinjaPath(
    gt.GetFullPath(cfgName, cmStateEnums::RuntimeBinaryArtifact,
                   /*realname=*/true));
  std::string targetOutputImplib = ConvertToNinjaPath(
    gt.GetFullPath(cfgName, cmStateEnums::ImportLibraryArtifact));

  if (gt.IsAppBundleOnApple()) {
    // Create the app bundle
    std::string outpath = gt.GetDirectory(cfgName);
    this->OSXBundleGenerator->CreateAppBundle(this->TargetNames.Output,
                                              outpath);

    // Calculate the output path
    targetOutput = outpath;
    targetOutput += "/";
    targetOutput += this->TargetNames.Output;
    targetOutput = this->ConvertToNinjaPath(targetOutput);
    targetOutputReal = outpath;
    targetOutputReal += "/";
    targetOutputReal += this->TargetNames.Real;
    targetOutputReal = this->ConvertToNinjaPath(targetOutputReal);
  } else if (gt.IsFrameworkOnApple()) {
    // Create the library framework.
    this->OSXBundleGenerator->CreateFramework(this->TargetNames.Output,
                                              gt.GetDirectory(cfgName));
  } else if (gt.IsCFBundleOnApple()) {
    // Create the core foundation bundle.
    this->OSXBundleGenerator->CreateCFBundle(this->TargetNames.Output,
                                             gt.GetDirectory(cfgName));
  }

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmStateEnums::TargetType targetType = gt.GetType();
  this->GetBuildFileStream()
    << "# Link build statements for " << cmState::GetTargetTypeName(targetType)
    << " target " << this->GetTargetName() << "\n\n";

  cmNinjaDeps emptyDeps;
  cmNinjaVars vars;

  // Compute the comment.
  std::ostringstream comment;
  comment << "Link the " << this->GetVisibleTypeName() << " "
          << targetOutputReal;

  // Compute outputs.
  cmNinjaDeps outputs;
  outputs.push_back(targetOutputReal);

  if (this->TargetLinkLanguage == "Swift") {
    if (const char* name = gt.GetProperty("SWIFT_MODULE_NAME")) {
      vars["TARGET_SWIFT_DOC"] = std::string(name) + ".swiftdoc";
      vars["TARGET_SWIFT_MODULE"] = std::string(name) + ".swiftmodule";
    } else {
      vars["TARGET_SWIFT_DOC"] = gt.GetName() + ".swiftdoc";
      vars["TARGET_SWIFT_MODULE"] = gt.GetName() + ".swiftmodule";
    }
    outputs.push_back(vars["TARGET_SWIFT_DOC"]);
    outputs.push_back(vars["TARGET_SWIFT_MODULE"]);

    cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

    std::string partials;
    std::vector<cmSourceFile const*> sources;
    gt.GetObjectSources(sources, this->GetConfigName());
    for (cmSourceFile const* source : sources) {
      partials += " ";
      if (const char* partial = source->GetProperty("SWIFT_PARTIAL_MODULE")) {
        partials += partial;
      } else {
        partials += localGen.GetTargetDirectory(&gt) + "/" +
          gt.GetObjectName(source) + ".swiftmodule";
      }
    }
    vars["SWIFT_PARTIAL_MODULES"] = partials;
  }

  // Compute specific libraries to link with.
  cmNinjaDeps explicitDeps = this->GetObjects();
  cmNinjaDeps implicitDeps = this->ComputeLinkDeps(this->TargetLinkLanguage);

  if (!this->DeviceLinkObject.empty()) {
    explicitDeps.push_back(this->DeviceLinkObject);
  }

  cmMakefile* mf = this->GetMakefile();

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    gt.GetCreateRuleVariable(this->TargetLinkLanguage, this->GetConfigName());
  bool useWatcomQuote = mf->IsOn(createRule + "_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmOutputConverter::SHELL);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    this->GetGlobalGenerator()->CreateLinkLineComputer(
      this->GetLocalGenerator(),
      this->GetLocalGenerator()->GetStateSnapshot().GetDirectory()));
  linkLineComputer->SetUseWatcomQuote(useWatcomQuote);

  localGen.GetTargetFlags(linkLineComputer.get(), this->GetConfigName(),
                          vars["LINK_LIBRARIES"], vars["FLAGS"],
                          vars["LINK_FLAGS"], frameworkPath, linkPath, &gt);

  // Add OS X version flags, if any.
  if (this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
    this->AppendOSXVerFlag(vars["LINK_FLAGS"], this->TargetLinkLanguage,
                           "COMPATIBILITY", true);
    this->AppendOSXVerFlag(vars["LINK_FLAGS"], this->TargetLinkLanguage,
                           "CURRENT", false);
  }

  this->addPoolNinjaVariable("JOB_POOL_LINK", &gt, vars);

  this->AddModuleDefinitionFlag(linkLineComputer.get(), vars["LINK_FLAGS"]);
  vars["LINK_FLAGS"] =
    cmGlobalNinjaGenerator::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;
  std::string lwyuFlags;
  if (gt.GetPropertyAsBool("LINK_WHAT_YOU_USE")) {
    lwyuFlags = " -Wl,--no-as-needed";
  }

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, &gt, TargetLinkLanguage, cfgName);
    t += lwyuFlags;
    vars["FLAGS"] = t;
  } else {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, &gt, TargetLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t.clear();
    t += lwyuFlags;
    localGen.AddLanguageFlagsForLinking(t, &gt, TargetLinkLanguage, cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
  }
  if (this->GetGeneratorTarget()->HasSOName(cfgName)) {
    vars["SONAME_FLAG"] = mf->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNames.SharedObject;
    if (targetType == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  cmNinjaDeps byproducts;

  if (!this->TargetNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
    if (gt.HasImportLibrary(cfgName)) {
      byproducts.push_back(targetOutputImplib);
    }
  }

  if (!this->SetMsvcTargetPdbVariable(vars)) {
    // It is common to place debug symbols at a specific place,
    // so we need a plain target name in the rule available.
    std::string prefix;
    std::string base;
    std::string suffix;
    this->GetGeneratorTarget()->GetFullNameComponents(prefix, base, suffix);
    std::string dbg_suffix = ".dbg";
    // TODO: Where to document?
    if (mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX")) {
      dbg_suffix = mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX");
    }
    vars["TARGET_PDB"] = base + suffix + dbg_suffix;
  }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  EnsureDirectoryExists(objPath);

  if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  const std::vector<cmCustomCommand>* cmdLists[3] = {
    &gt.GetPreBuildCommands(), &gt.GetPreLinkCommands(),
    &gt.GetPostBuildCommands()
  };

  std::vector<std::string> preLinkCmdLines, postBuildCmdLines;
  std::vector<std::string>* cmdLineLists[3] = { &preLinkCmdLines,
                                                &preLinkCmdLines,
                                                &postBuildCmdLines };

  for (unsigned i = 0; i != 3; ++i) {
    for (cmCustomCommand const& cc : *cmdLists[i]) {
      cmCustomCommandGenerator ccg(cc, cfgName, this->GetLocalGenerator());
      localGen.AppendCustomCommandLines(ccg, *cmdLineLists[i]);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(byproducts), MapToNinjaPath());
    }
  }

  // maybe create .def file from list of objects
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    gt.GetModuleDefinitionInfo(this->GetConfigName());
  if (mdi && mdi->DefFileGenerated) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    std::string cmd = cmakeCommand;
    cmd += " -E __create_def ";
    cmd += this->GetLocalGenerator()->ConvertToOutputFormat(
      mdi->DefFile, cmOutputConverter::SHELL);
    cmd += " ";
    std::string obj_list_file = mdi->DefFile + ".objs";
    cmd += this->GetLocalGenerator()->ConvertToOutputFormat(
      obj_list_file, cmOutputConverter::SHELL);
    preLinkCmdLines.push_back(std::move(cmd));

    // create a list of obj files for the -E __create_def to read
    cmGeneratedFileStream fout(obj_list_file);

    if (mdi->WindowsExportAllSymbols) {
      cmNinjaDeps objs = this->GetObjects();
      for (std::string const& obj : objs) {
        if (cmHasLiteralSuffix(obj, ".obj")) {
          fout << obj << "\n";
        }
      }
    }

    for (cmSourceFile const* src : mdi->Sources) {
      fout << src->GetFullPath() << "\n";
    }
  }
  // If we have any PRE_LINK commands, we need to go back to CMAKE_BINARY_DIR
  // for
  // the link commands.
  if (!preLinkCmdLines.empty()) {
    const std::string homeOutDir = localGen.ConvertToOutputFormat(
      localGen.GetBinaryDirectory(), cmOutputConverter::SHELL);
    preLinkCmdLines.push_back("cd " + homeOutDir);
  }

  vars["PRE_LINK"] = localGen.BuildCommandLine(preLinkCmdLines, "pre-link",
                                               this->GeneratorTarget);
  std::string postBuildCmdLine = localGen.BuildCommandLine(
    postBuildCmdLines, "post-build", this->GeneratorTarget);

  cmNinjaVars symlinkVars;
  bool const symlinkNeeded =
    (targetOutput != targetOutputReal && !gt.IsFrameworkOnApple());
  if (!symlinkNeeded) {
    vars["POST_BUILD"] = postBuildCmdLine;
  } else {
    vars["POST_BUILD"] = cmGlobalNinjaGenerator::SHELL_NOOP;
    symlinkVars["POST_BUILD"] = postBuildCmdLine;
  }
  cmGlobalNinjaGenerator& globalGen = *this->GetGlobalGenerator();

  bool const lang_supports_response =
    !(this->TargetLinkLanguage == "RC" || this->TargetLinkLanguage == "CUDA");
  int commandLineLengthLimit = -1;
  if (!lang_supports_response || !this->ForceResponseFile()) {
    commandLineLengthLimit =
      static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
      globalGen.GetRuleCmdLength(this->LanguageLinkerRule());
  }

  const std::string rspfile = this->ConvertToNinjaPath(
    std::string("CMakeFiles/") + gt.GetName() + ".rsp");

  // Gather order-only dependencies.
  cmNinjaDeps orderOnlyDeps;
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 orderOnlyDeps);

  // Ninja should restat after linking if and only if there are byproducts.
  vars["RESTAT"] = byproducts.empty() ? "" : "1";

  for (std::string const& o : byproducts) {
    this->GetGlobalGenerator()->SeenCustomCommandOutput(o);
    outputs.push_back(o);
  }

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen.WriteBuild(this->GetBuildFileStream(), comment.str(),
                       this->LanguageLinkerRule(), outputs,
                       /*implicitOuts=*/cmNinjaDeps(), explicitDeps,
                       implicitDeps, orderOnlyDeps, vars, rspfile,
                       commandLineLengthLimit, &usedResponseFile);
  this->WriteLinkRule(usedResponseFile);

  if (symlinkNeeded) {
    if (targetType == cmStateEnums::EXECUTABLE) {
      globalGen.WriteBuild(
        this->GetBuildFileStream(),
        "Create executable symlink " + targetOutput,
        "CMAKE_SYMLINK_EXECUTABLE", cmNinjaDeps(1, targetOutput),
        /*implicitOuts=*/cmNinjaDeps(), cmNinjaDeps(1, targetOutputReal),
        emptyDeps, emptyDeps, symlinkVars);
    } else {
      cmNinjaDeps symlinks;
      std::string const soName = this->ConvertToNinjaPath(
        this->GetTargetFilePath(this->TargetNames.SharedObject));
      // If one link has to be created.
      if (targetOutputReal == soName || targetOutput == soName) {
        symlinkVars["SONAME"] = soName;
      } else {
        symlinkVars["SONAME"].clear();
        symlinks.push_back(soName);
      }
      symlinks.push_back(targetOutput);
      globalGen.WriteBuild(
        this->GetBuildFileStream(), "Create library symlink " + targetOutput,
        "CMAKE_SYMLINK_LIBRARY", symlinks,
        /*implicitOuts=*/cmNinjaDeps(), cmNinjaDeps(1, targetOutputReal),
        emptyDeps, emptyDeps, symlinkVars);
    }
  }

  // Add aliases for the file name and the target name.
  globalGen.AddTargetAlias(this->TargetNames.Output, &gt);
  globalGen.AddTargetAlias(this->GetTargetName(), &gt);
}